

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

string * __thiscall
cli::Parser::
CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
print_value(string *__return_storage_ptr__,
           CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->value);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string print_value() const {
				return stringify(value);
			}